

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
ft::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,value_type *val)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  pointer pbVar4;
  size_t in_RDX;
  
  uVar3 = this->m_size;
  if (this->m_capacity <= uVar3) {
    realloc(this,(void *)(this->m_capacity * 2),in_RDX);
    uVar3 = this->m_size;
  }
  pbVar1 = this->m_data;
  pbVar4 = pbVar1 + uVar3;
  (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
  pcVar2 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar1 + uVar3),pcVar2,pcVar2 + val->_M_string_length);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void		push_back(value_type const & val) {
		if (this->size() >= this->capacity())
			this->realloc(this->capacity() * 2);
		this->get_allocator().construct(this->m_data + this->size(), val);
		++this->m_size;
	}